

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_quality.hpp
# Opt level: O0

void __thiscall
Omega_h::MetricElementQualities<2,_1>::~MetricElementQualities(MetricElementQualities<2,_1> *this)

{
  MetricElementQualities<3,_3> *this_local;
  
  Read<double>::~Read((Read<double> *)(this + 0x10));
  Read<double>::~Read((Read<double> *)this);
  return;
}

Assistant:

MetricElementQualities(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}